

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

int uv_async_init(uv_loop_t *loop,uv_async_t *handle,uv_async_cb async_cb)

{
  uint *puVar1;
  uint uVar2;
  uv__queue *puVar3;
  int iVar4;
  
  iVar4 = uv__async_start(loop);
  if (iVar4 == 0) {
    handle->loop = loop;
    handle->type = UV_ASYNC;
    handle->flags = 8;
    (handle->handle_queue).next = &loop->handle_queue;
    puVar3 = (loop->handle_queue).prev;
    (handle->handle_queue).prev = puVar3;
    puVar3->next = &handle->handle_queue;
    (loop->handle_queue).prev = &handle->handle_queue;
    handle->next_closing = (uv_handle_t *)0x0;
    handle->async_cb = async_cb;
    handle->pending = 0;
    (handle->u).fd = 0;
    (handle->queue).next = &loop->async_handles;
    puVar3 = (loop->async_handles).prev;
    (handle->queue).prev = puVar3;
    puVar3->next = &handle->queue;
    (loop->async_handles).prev = &handle->queue;
    uVar2 = handle->flags;
    if (((uVar2 & 4) == 0) && (handle->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
  }
  return iVar4;
}

Assistant:

int uv_async_init(uv_loop_t* loop, uv_async_t* handle, uv_async_cb async_cb) {
  int err;

  err = uv__async_start(loop);
  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*)handle, UV_ASYNC);
  handle->async_cb = async_cb;
  handle->pending = 0;
  handle->u.fd = 0; /* This will be used as a busy flag. */

  uv__queue_insert_tail(&loop->async_handles, &handle->queue);
  uv__handle_start(handle);

  return 0;
}